

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

char * duplicate_stringlist(char *input)

{
  char cVar1;
  size_t sVar2;
  void *__dest;
  char *pcVar3;
  
  if (input == (char *)0x0) {
    pcVar3 = strdup("");
    return pcVar3;
  }
  cVar1 = *input;
  pcVar3 = input;
  while (cVar1 != '\0') {
    sVar2 = strlen(pcVar3);
    pcVar3 = pcVar3 + sVar2 + 1;
    cVar1 = *pcVar3;
  }
  __dest = malloc((size_t)(pcVar3 + (1 - (long)input)));
  if (__dest != (void *)0x0) {
    pcVar3 = (char *)memcpy(__dest,input,(size_t)(pcVar3 + (1 - (long)input)));
    return pcVar3;
  }
  return (char *)0x0;
}

Assistant:

static char *duplicate_stringlist(const char *input)
{
    if (input == NULL)
        return strdup("");

    char *result;
    const char *in_tail;

    for (in_tail = input; in_tail[0] != '\0'; in_tail += strlen(in_tail) + 1)
        ;
    ++in_tail;
    if ((result = malloc(in_tail - input)) == NULL)
        return NULL;
    memcpy(result, input, in_tail - input);
    return result;
}